

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_thread.c
# Opt level: O0

int reset(AVxWorker *worker)

{
  int iVar1;
  uint extraout_EAX;
  void *pvVar2;
  long *in_RDI;
  size_t stacksize;
  size_t kMinStackSize;
  pthread_attr_t attr;
  int ok;
  void *in_stack_ffffffffffffffa0;
  size_t in_stack_ffffffffffffffa8;
  pthread_attr_t local_50;
  uint local_14;
  long *local_10;
  uint local_4;
  
  local_14 = 1;
  *(undefined4 *)(in_RDI + 6) = 0;
  if ((int)in_RDI[1] == 0) {
    local_10 = in_RDI;
    pvVar2 = aom_calloc(in_stack_ffffffffffffffa8,(size_t)in_stack_ffffffffffffffa0);
    *local_10 = (long)pvVar2;
    if (*local_10 == 0) {
      return 0;
    }
    iVar1 = pthread_mutex_init((pthread_mutex_t *)*local_10,(pthread_mutexattr_t *)0x0);
    if (iVar1 == 0) {
      iVar1 = pthread_cond_init((pthread_cond_t *)(*local_10 + 0x28),(pthread_condattr_t *)0x0);
      if (iVar1 == 0) {
        iVar1 = pthread_attr_init(&local_50);
        if (iVar1 == 0) {
          iVar1 = pthread_attr_getstacksize(&local_50,(size_t *)&stack0xffffffffffffffa0);
          if (((iVar1 == 0) && (in_stack_ffffffffffffffa0 < (void *)0x40000)) &&
             (iVar1 = pthread_attr_setstacksize(&local_50,0x40000), iVar1 != 0)) {
            pthread_attr_destroy(&local_50);
          }
          else {
            pthread_mutex_lock((pthread_mutex_t *)*local_10);
            iVar1 = pthread_create((pthread_t *)(*local_10 + 0x58),&local_50,thread_loop,local_10);
            local_14 = (uint)((iVar1 != 0 ^ 0xffU) & 1);
            if (local_14 != 0) {
              *(undefined4 *)(local_10 + 1) = 1;
            }
            pthread_mutex_unlock((pthread_mutex_t *)*local_10);
            pthread_attr_destroy(&local_50);
            if (local_14 != 0) goto LAB_006ba5d4;
          }
        }
        pthread_mutex_destroy((pthread_mutex_t *)*local_10);
        pthread_cond_destroy((pthread_cond_t *)(*local_10 + 0x28));
      }
      else {
        pthread_mutex_destroy((pthread_mutex_t *)*local_10);
      }
    }
    aom_free(in_stack_ffffffffffffffa0);
    *local_10 = 0;
    local_4 = 0;
  }
  else {
    if (1 < *(uint *)(in_RDI + 1)) {
      sync();
      local_14 = extraout_EAX;
    }
LAB_006ba5d4:
    local_4 = local_14;
  }
  return local_4;
}

Assistant:

static int reset(AVxWorker *const worker) {
  int ok = 1;
  worker->had_error = 0;
  if (worker->status_ < AVX_WORKER_STATUS_OK) {
#if CONFIG_MULTITHREAD
    worker->impl_ = (AVxWorkerImpl *)aom_calloc(1, sizeof(*worker->impl_));
    if (worker->impl_ == NULL) {
      return 0;
    }
    if (pthread_mutex_init(&worker->impl_->mutex_, NULL)) {
      goto Error;
    }
    if (pthread_cond_init(&worker->impl_->condition_, NULL)) {
      pthread_mutex_destroy(&worker->impl_->mutex_);
      goto Error;
    }
    pthread_attr_t attr;
    if (pthread_attr_init(&attr)) goto Error2;
      // Debug ASan builds require at least ~1MiB of stack; prevents
      // failures on macOS arm64 where the default is 512KiB.
      // See: https://crbug.com/aomedia/3379
#if defined(AOM_ADDRESS_SANITIZER) && defined(__APPLE__) && AOM_ARCH_ARM && \
    !defined(NDEBUG)
    const size_t kMinStackSize = 1024 * 1024;
#else
    const size_t kMinStackSize = 256 * 1024;
#endif
    size_t stacksize;
    if (!pthread_attr_getstacksize(&attr, &stacksize)) {
      if (stacksize < kMinStackSize &&
          pthread_attr_setstacksize(&attr, kMinStackSize)) {
        pthread_attr_destroy(&attr);
        goto Error2;
      }
    }
    pthread_mutex_lock(&worker->impl_->mutex_);
    ok = !pthread_create(&worker->impl_->thread_, &attr, thread_loop, worker);
    if (ok) worker->status_ = AVX_WORKER_STATUS_OK;
    pthread_mutex_unlock(&worker->impl_->mutex_);
    pthread_attr_destroy(&attr);
    if (!ok) {
    Error2:
      pthread_mutex_destroy(&worker->impl_->mutex_);
      pthread_cond_destroy(&worker->impl_->condition_);
    Error:
      aom_free(worker->impl_);
      worker->impl_ = NULL;
      return 0;
    }
#else
    worker->status_ = AVX_WORKER_STATUS_OK;
#endif
  } else if (worker->status_ > AVX_WORKER_STATUS_OK) {
    ok = sync(worker);
  }
  assert(!ok || (worker->status_ == AVX_WORKER_STATUS_OK));
  return ok;
}